

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_internal.h
# Opt level: O2

bool __thiscall bssl::Vector<TagAndArray>::Push(Vector<TagAndArray> *this,TagAndArray *elem)

{
  ulong uVar1;
  TagAndArray *pTVar2;
  TagAndArray *pTVar3;
  long lVar4;
  int line;
  size_t sVar5;
  ulong uVar6;
  
  uVar6 = this->size_;
  uVar1 = this->capacity_;
  if (uVar6 < uVar1) {
    pTVar3 = this->data_;
  }
  else {
    if (uVar1 == 0) {
      sVar5 = 0x10;
    }
    else {
      if ((long)uVar1 < 0) {
        line = 0x14d;
LAB_002d3d2b:
        ERR_put_error(0xe,0,0x45,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_internal.h"
                      ,line);
        return false;
      }
      if (uVar1 >> 0x3a != 0) {
        line = 0x153;
        goto LAB_002d3d2b;
      }
      sVar5 = uVar1 * 2;
    }
    pTVar3 = (TagAndArray *)OPENSSL_malloc(sVar5 << 5);
    if (pTVar3 == (TagAndArray *)0x0) {
      return false;
    }
    pTVar2 = this->data_;
    uVar6 = this->size_;
    for (lVar4 = 0; uVar6 << 5 != lVar4; lVar4 = lVar4 + 0x20) {
      anon_unknown_0::VectorTest_VectorContainingVectors_Test::TestBody::TagAndArray::TagAndArray
                ((TagAndArray *)((long)&pTVar3->tag + lVar4),
                 (TagAndArray *)((long)&pTVar2->tag + lVar4));
    }
    clear(this);
    this->data_ = pTVar3;
    this->size_ = uVar6;
    this->capacity_ = sVar5;
  }
  anon_unknown_0::VectorTest_VectorContainingVectors_Test::TestBody::TagAndArray::TagAndArray
            (pTVar3 + uVar6,elem);
  this->size_ = this->size_ + 1;
  return true;
}

Assistant:

[[nodiscard]] bool Push(T elem) {
    if (!MaybeGrow()) {
      return false;
    }
    new (&data_[size_]) T(std::move(elem));
    size_++;
    return true;
  }